

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

char * __thiscall CServer::ClientClan(CServer *this,int ClientID)

{
  char *pcVar1;
  
  if (0x3f < (uint)ClientID) {
    return "";
  }
  pcVar1 = "";
  if (this->m_aClients[(uint)ClientID].m_State == 5) {
    pcVar1 = this->m_aClients[(uint)ClientID].m_aClan;
  }
  return pcVar1;
}

Assistant:

const char *CServer::ClientClan(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return "";
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_aClan;
	else
		return "";
}